

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareEquivalentUnitsWhichHaveNonStandardBase_Test::TestBody
          (Units_compareEquivalentUnitsWhichHaveNonStandardBase_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  ModelPtr model;
  UnitsPtr u;
  AssertionResult local_90;
  long local_80 [2];
  long *local_70;
  AssertHelper local_68 [8];
  char local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  psVar1 = local_30;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  libcellml::Units::create();
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"u","");
  libcellml::NamedEntity::setName(local_20);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_40;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"u","");
  libcellml::Units::addUnit(local_40);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_50;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"u","");
  libcellml::Units::addUnit(local_50);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_30);
  libcellml::Model::addUnits((shared_ptr *)local_30);
  libcellml::Model::addUnits((shared_ptr *)local_30);
  local_60[0] = libcellml::Units::equivalent((shared_ptr *)&local_40,(shared_ptr *)&local_50);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,local_60,"libcellml::Units::equivalent(u1, u2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x608,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((long *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60[0] = libcellml::Units::equivalent((shared_ptr *)&local_50,(shared_ptr *)&local_40);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,local_60,"libcellml::Units::equivalent(u2, u1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x609,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((long *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Units, compareEquivalentUnitsWhichHaveNonStandardBase)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("u");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("u");

    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
    EXPECT_TRUE(libcellml::Units::equivalent(u2, u1));
}